

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yyjson.cpp
# Opt level: O0

bool duckdb_yyjson::unsafe_yyjson_mut_equals(yyjson_mut_val *lhs,yyjson_mut_val *rhs)

{
  void *__s2;
  ulong uVar1;
  ulong uVar2;
  byte bVar3;
  byte bVar4;
  int iVar5;
  ulong *puVar6;
  ulong *puVar7;
  ulong uVar8;
  ulong *in_RSI;
  ulong *in_RDI;
  bool bVar9;
  usize len_1;
  yyjson_mut_obj_iter iter;
  usize len;
  yyjson_type type;
  uint8_t tag_1;
  uint8_t tag;
  yyjson_subtype rt;
  yyjson_subtype lt;
  yyjson_val_uni *runi;
  yyjson_val_uni *luni;
  usize len_2;
  yyjson_mut_val *cur;
  yyjson_mut_val *pre;
  size_t max;
  size_t idx;
  uint8_t tag_2;
  uint8_t tag_4;
  uint8_t tag_3;
  bool local_1e3;
  bool local_1e2;
  ulong *local_1e0;
  bool local_1d2;
  ulong local_1c8;
  ulong local_1c0;
  ulong local_1b8;
  ulong *local_1b0;
  ulong *local_1a8;
  ulong local_198;
  undefined7 in_stack_fffffffffffffe70;
  yyjson_mut_val *lhs_00;
  ulong *local_180;
  bool local_172;
  bool local_101;
  bool local_e1;
  ulong *local_b0;
  ulong local_98;
  yyjson_mut_val *local_78;
  
  bVar3 = (byte)*in_RDI & 7;
  if (bVar3 == ((byte)*in_RSI & 7)) {
    switch(bVar3) {
    case 1:
    case 5:
      if (*in_RDI >> 8 == *in_RSI >> 8) {
        iVar5 = memcmp((void *)in_RDI[1],(void *)in_RSI[1],*in_RDI >> 8);
        local_e1 = iVar5 == 0;
      }
      else {
        local_e1 = false;
      }
      local_172 = local_e1;
      break;
    case 2:
    case 3:
      local_172 = *in_RDI == *in_RSI;
      break;
    case 4:
      puVar6 = in_RDI + 1;
      puVar7 = in_RSI + 1;
      bVar3 = (byte)*in_RDI & 0x18;
      bVar4 = (byte)*in_RSI & 0x18;
      if (bVar3 == bVar4) {
        local_101 = *puVar6 == *puVar7;
      }
      else if ((bVar3 == 8) && ((*in_RSI & 0x18) == 0)) {
        local_1e2 = false;
        if (-1 < (long)*puVar6) {
          local_1e2 = *puVar6 == *puVar7;
        }
        local_101 = local_1e2;
      }
      else if (((*in_RDI & 0x18) == 0) && (bVar4 == 8)) {
        local_1e3 = false;
        if (-1 < (long)*puVar7) {
          local_1e3 = *puVar6 == *puVar7;
        }
        local_101 = local_1e3;
      }
      else {
        local_101 = false;
      }
      local_172 = local_101;
      break;
    case 6:
      local_1c8 = *in_RDI >> 8;
      if (local_1c8 == *in_RSI >> 8) {
        if (local_1c8 != 0) {
          lhs_00 = (yyjson_mut_val *)in_RSI[1];
          while (local_1c8 != 0) {
            bVar9 = unsafe_yyjson_mut_equals
                              (lhs_00,(yyjson_mut_val *)CONCAT17(bVar3,in_stack_fffffffffffffe70));
            if (!bVar9) {
              return false;
            }
            lhs_00 = lhs_00->next;
            local_1c8 = local_1c8 - 1;
          }
        }
        local_172 = true;
      }
      else {
        local_172 = false;
      }
      break;
    case 7:
      local_198 = *in_RDI >> 8;
      if (local_198 == *in_RSI >> 8) {
        if (local_198 != 0) {
          if (in_RSI == (ulong *)0x0) {
            local_1d2 = false;
          }
          else {
            local_1d2 = ((byte)*in_RSI & 7) == 7;
          }
          local_1d2 = local_1d2 && &local_1c0 != (ulong *)0x0;
          if (local_1d2) {
            local_1c0 = 0;
            local_1b8 = *in_RSI >> 8;
            if (local_1b8 == 0) {
              local_1e0 = (ulong *)0x0;
            }
            else {
              local_1e0 = (ulong *)in_RSI[1];
            }
            local_1b0 = local_1e0;
            local_1a8 = (ulong *)0x0;
          }
          else if (&local_1c0 != (ulong *)0x0) {
            memset(&local_1c0,0,0x28);
          }
          local_180 = (ulong *)in_RDI[1];
          while (uVar2 = local_1b8, uVar8 = local_198 - 1, local_198 != 0) {
            __s2 = (void *)local_180[1];
            uVar1 = *local_180;
            local_198 = uVar8;
            if ((&stack0x00000000 == (undefined1 *)0x1c0) || (__s2 == (void *)0x0)) {
LAB_02747a3c:
              local_78 = (yyjson_mut_val *)0x0;
            }
            else {
              local_98 = 0;
              puVar6 = local_1b0;
              do {
                local_b0 = puVar6;
                uVar8 = local_98 + 1;
                if (uVar2 <= local_98) goto LAB_02747a3c;
                puVar6 = *(ulong **)(local_b0[2] + 0x10);
                bVar9 = false;
                if (*puVar6 >> 8 == uVar1 >> 8) {
                  iVar5 = memcmp((void *)puVar6[1],__s2,uVar1 >> 8);
                  bVar9 = iVar5 == 0;
                }
                local_98 = uVar8;
              } while (!bVar9);
              local_1c0 = uVar8 + local_1c0;
              if (uVar2 < local_1c0) {
                local_1c0 = local_1c0 - (uVar2 + 1);
              }
              local_1a8 = local_b0;
              local_78 = (yyjson_mut_val *)puVar6[2];
              local_1b0 = puVar6;
            }
            if (local_78 == (yyjson_mut_val *)0x0) {
              return false;
            }
            bVar9 = unsafe_yyjson_mut_equals
                              (local_78,(yyjson_mut_val *)CONCAT17(bVar3,in_stack_fffffffffffffe70))
            ;
            if (!bVar9) {
              return false;
            }
            local_180 = *(ulong **)(local_180[2] + 0x10);
          }
        }
        local_172 = true;
      }
      else {
        local_172 = false;
      }
      break;
    default:
      local_172 = false;
    }
  }
  else {
    local_172 = false;
  }
  return local_172;
}

Assistant:

bool unsafe_yyjson_mut_equals(yyjson_mut_val *lhs, yyjson_mut_val *rhs) {
    yyjson_type type = unsafe_yyjson_get_type(lhs);
    if (type != unsafe_yyjson_get_type(rhs)) return false;

    switch (type) {
        case YYJSON_TYPE_OBJ: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                yyjson_mut_obj_iter iter;
                yyjson_mut_obj_iter_init(rhs, &iter);
                lhs = (yyjson_mut_val *)lhs->uni.ptr;
                while (len-- > 0) {
                    rhs = yyjson_mut_obj_iter_getn(&iter, lhs->uni.str,
                                                   unsafe_yyjson_get_len(lhs));
                    if (!rhs) return false;
                    if (!unsafe_yyjson_mut_equals(lhs->next, rhs)) return false;
                    lhs = lhs->next->next;
                }
            }
            /* yyjson allows duplicate keys, so the check may be inaccurate */
            return true;
        }

        case YYJSON_TYPE_ARR: {
            usize len = unsafe_yyjson_get_len(lhs);
            if (len != unsafe_yyjson_get_len(rhs)) return false;
            if (len > 0) {
                lhs = (yyjson_mut_val *)lhs->uni.ptr;
                rhs = (yyjson_mut_val *)rhs->uni.ptr;
                while (len-- > 0) {
                    if (!unsafe_yyjson_mut_equals(lhs, rhs)) return false;
                    lhs = lhs->next;
                    rhs = rhs->next;
                }
            }
            return true;
        }

        case YYJSON_TYPE_NUM:
            return unsafe_yyjson_num_equals(lhs, rhs);

        case YYJSON_TYPE_RAW:
        case YYJSON_TYPE_STR:
            return unsafe_yyjson_str_equals(lhs, rhs);

        case YYJSON_TYPE_NULL:
        case YYJSON_TYPE_BOOL:
            return lhs->tag == rhs->tag;

        default:
            return false;
    }
}